

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcomp.c
# Opt level: O1

void objcomp(mcmcxdef *mctx,objnum objn,int for_debug)

{
  ushort *puVar1;
  byte bVar2;
  uchar *puVar3;
  prpnum *ppVar4;
  prpnum *ppVar5;
  uint uVar6;
  
  puVar3 = mcmlck(mctx,objn);
  uVar6 = (uint)*(ushort *)(puVar3 + 6);
  if (*(ushort *)(puVar3 + 6) != 0) {
    ppVar5 = (prpnum *)(puVar3 + (ulong)*(ushort *)(puVar3 + 4) * 2 + 0xe);
    do {
      ppVar4 = (prpnum *)((long)ppVar5 + (ulong)*(ushort *)((long)ppVar5 + 3) + 6);
      bVar2 = *(byte *)((long)ppVar5 + 5);
      if ((bVar2 & 2) != 0) {
        if (for_debug == 0) {
          *(byte *)((long)ppVar5 + 5) = bVar2 & 0xf8;
          objdelp(mctx,objn,*ppVar5,0);
          ppVar4 = ppVar5;
        }
        else {
          *(byte *)((long)ppVar5 + 5) = bVar2 & 0xf9 | 4;
        }
      }
      uVar6 = uVar6 - 1;
      ppVar5 = ppVar4;
    } while (uVar6 != 0);
  }
  uVar6 = *(uint *)(puVar3 + 6);
  *(uint *)(puVar3 + 10) = uVar6;
  if ((short)uVar6 != 0) {
    puVar3 = puVar3 + (ulong)*(ushort *)(puVar3 + 4) * 2 + 0xe;
    uVar6 = uVar6 & 0xffff;
    do {
      puVar3[5] = puVar3[5] | 1;
      puVar3 = puVar3 + (ulong)*(ushort *)(puVar3 + 3) + 6;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  puVar1 = (ushort *)
           ((long)&mctx->mcmcxgl->mcmcxtab[mctx->mcmcxmtb[objn >> 8][objn & 0xff] >> 8]->mcmoflg +
           (ulong)((mctx->mcmcxmtb[objn >> 8][objn & 0xff] & 0xff) << 5));
  *puVar1 = *puVar1 | 1;
  mcmunlck(mctx,objn);
  return;
}

Assistant:

void objcomp(mcmcxdef *mctx, objnum objn, int for_debug)
{
    objdef *objptr;
    prpdef *p;
    prpdef *nxt;
    int     cnt;
    
    /* lock object */
    objptr = (objdef *)mcmlck(mctx, (mcmon)objn);

    /* 
     *   first, go through the properties, and delete each one that's
     *   marked as ignored 
     */
    for (cnt = objnprop(objptr), p = objprp(objptr) ; cnt != 0 ;
         p = nxt, --cnt)
    {
        /* remember the next property */
        nxt = objpnxt(p);

        /* if this is marked as being ignored, delete it */
        if ((prpflg(p) & PRPFIGN) != 0)
        {
            /* 
             *   Delete the property.  If we're compiling in debug mode,
             *   don't really delete anything, but simply mark the
             *   property as deleted; this is necessary because certain
             *   debug records are not self-relative, hence are not
             *   tolerant of changes to the internal structure of the
             *   object.  If we're not compiling for debugging, we can
             *   actually delete properties, because all non-debug code is
             *   completely self-relative and thus can be moved around
             *   inside the object without any problems.  
             */
            if (for_debug)
            {
                /* simply mark the property as deleted */
                prpflg(p) |= PRPFDEL;

                /* 
                 *   clear the IGNORE flag, since we IGNORE and DELETED
                 *   are mutually exclusive 
                 */
                prpflg(p) &= ~PRPFIGN;
            }
            else
            {
                /* clear the flags so we can really delete it */
                prpflg(p) &= ~(PRPFORG | PRPFIGN | PRPFDEL);

                /* delete it */
                objdelp(mctx, objn, (prpnum)prpprop(p), FALSE);

                /* 
                 *   continue from the present location, since we moved
                 *   the next property to the current location 
                 */
                nxt = p;
            }
        }
    }
    
    /* set static entries:  free space pointer, and number of properties */
    objsetst(objptr, objnprop(objptr));
    objsetrst(objptr, objfree(objptr));

    /* go through properties, marking each as original */
    for (cnt = objnprop(objptr), p = objprp(objptr) ; cnt != 0 ;
         p = objpnxt(p), --cnt)
    {
        assert(p < objptr + mcmobjsiz(mctx, (mcmon)objn));
        prpflg(p) |= PRPFORG;             /* set ORIGINAL flag for property */
    }
    
    /* mark object changed, and unlock it */
    mcmtch(mctx, objn);
    mcmunlck(mctx, objn);
}